

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O2

string * __thiscall
pbrt::ParallelForLoop1D::ToString_abi_cxx11_(string *__return_storage_ptr__,ParallelForLoop1D *this)

{
  int *in_R9;
  
  StringPrintf<long_const&,long_const&,int_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ ParallelForLoop1D nextIndex: %d maxIndex: %d chunkSize: %d ]",
             (char *)&this->nextIndex,&this->maxIndex,(long *)&this->chunkSize,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ ParallelForLoop1D nextIndex: %d maxIndex: %d "
                            "chunkSize: %d ]",
                            nextIndex, maxIndex, chunkSize);
    }